

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_prob(ngram_model_t *model,char **words,int32 n)

{
  int32 iVar1;
  int32 *history;
  ulong uVar2;
  int32 nused;
  
  history = (int32 *)__ckd_calloc__((long)(n + -1),4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x20d);
  for (uVar2 = 1; uVar2 < (uint)n; uVar2 = uVar2 + 1) {
    iVar1 = ngram_wid(model,words[uVar2]);
    history[uVar2 - 1] = iVar1;
  }
  iVar1 = ngram_wid(model,*words);
  iVar1 = ngram_ng_prob(model,iVar1,history,n + -1,&nused);
  ckd_free(history);
  return iVar1;
}

Assistant:

int32
ngram_prob(ngram_model_t * model, const char* const *words, int32 n)
{
    int32 *ctx_id;
    int32 nused;
    int32 prob;
    int32 wid;
    uint32 i;

    ctx_id = (int32 *) ckd_calloc(n - 1, sizeof(*ctx_id));
    for (i = 1; i < (uint32) n; ++i)
        ctx_id[i - 1] = ngram_wid(model, words[i]);

    wid = ngram_wid(model, *words);
    prob = ngram_ng_prob(model, wid, ctx_id, n - 1, &nused);
    ckd_free(ctx_id);

    return prob;
}